

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginDisabled(bool disabled)

{
  int *piVar1;
  float fVar2;
  uint uVar3;
  int *piVar4;
  ImGuiContext *pIVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  ImGuiContext *ctx;
  
  pIVar5 = GImGui;
  uVar3 = GImGui->CurrentItemFlags;
  if ((char)((uVar3 & 4) >> 2) == '\0' && disabled) {
    fVar2 = (GImGui->Style).Alpha;
    GImGui->DisabledAlphaBackup = fVar2;
    (pIVar5->Style).Alpha = fVar2 * (pIVar5->Style).DisabledAlpha;
  }
  if ((uVar3 & 4) != 0 || disabled) {
    pIVar5->CurrentItemFlags = uVar3 | 4;
  }
  iVar6 = (pIVar5->ItemFlagsStack).Size;
  if (iVar6 == (pIVar5->ItemFlagsStack).Capacity) {
    if (iVar6 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar6 / 2 + iVar6;
    }
    iVar9 = iVar6 + 1;
    if (iVar6 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    piVar7 = &(pIVar5->IO).MetricsActiveAllocations;
    *piVar7 = *piVar7 + 1;
    piVar7 = (int *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    piVar4 = (pIVar5->ItemFlagsStack).Data;
    if (piVar4 != (int *)0x0) {
      memcpy(piVar7,piVar4,(long)(pIVar5->ItemFlagsStack).Size << 2);
      piVar4 = (pIVar5->ItemFlagsStack).Data;
      if ((piVar4 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar4,GImAllocatorUserData);
    }
    (pIVar5->ItemFlagsStack).Data = piVar7;
    (pIVar5->ItemFlagsStack).Capacity = iVar9;
    iVar6 = (pIVar5->ItemFlagsStack).Size;
  }
  else {
    piVar7 = (pIVar5->ItemFlagsStack).Data;
  }
  piVar7[iVar6] = pIVar5->CurrentItemFlags;
  (pIVar5->ItemFlagsStack).Size = (pIVar5->ItemFlagsStack).Size + 1;
  pIVar5->DisabledStackSize = pIVar5->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabled(bool disabled)
{
    ImGuiContext& g = *GImGui;
    bool was_disabled = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (!was_disabled && disabled)
    {
        g.DisabledAlphaBackup = g.Style.Alpha;
        g.Style.Alpha *= g.Style.DisabledAlpha; // PushStyleVar(ImGuiStyleVar_Alpha, g.Style.Alpha * g.Style.DisabledAlpha);
    }
    if (was_disabled || disabled)
        g.CurrentItemFlags |= ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}